

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLVariant.cpp
# Opt level: O3

bool Kernel::MLVariant_AUX::createLiteralBindings
               (Literal *baseLit,LiteralList *alts,Clause *instCl,uint **boundVarData,
               uint ***altBindingPtrs,uint **altBindingData)

{
  uint uVar1;
  Term *l2;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  ArrayStoringBinder binder;
  ArrayStoringBinder local_a0;
  Clause *local_90;
  uint ***local_88;
  uint **local_80;
  VariableIterator local_78;
  
  local_90 = instCl;
  local_88 = altBindingPtrs;
  local_80 = boundVarData;
  if (createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
      ::variablePositions == '\0') {
    createLiteralBindings();
  }
  if (createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
      ::varNums == '\0') {
    createLiteralBindings();
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&createLiteralBindings::variablePositions);
  createLiteralBindings::varNums._size = 0;
  VariableIterator::VariableIterator(&local_78,&baseLit->super_Term);
LAB_005561c7:
  bVar3 = VariableIterator::hasNext(&local_78);
  if (bVar3) {
    local_78._used = true;
    uVar7 = local_78._stack._cursor[-1]->_content;
    if (createLiteralBindings::varNums._capacity == createLiteralBindings::varNums._size) {
      Lib::BinaryHeap<unsigned_int,_Lib::Int>::expand(&createLiteralBindings::varNums);
    }
    puVar6 = createLiteralBindings::varNums._data1;
    createLiteralBindings::varNums._size = createLiteralBindings::varNums._size + 1;
    createLiteralBindings::varNums._data1[createLiteralBindings::varNums._size] = (uint)(uVar7 >> 2)
    ;
    if (1 < (ulong)createLiteralBindings::varNums._size) {
      uVar8 = puVar6[createLiteralBindings::varNums._size];
      uVar7 = (ulong)createLiteralBindings::varNums._size;
      do {
        uVar2 = uVar7 >> 1;
        if (puVar6[uVar2] <= uVar8) break;
        uVar5 = (uint)uVar7;
        puVar6[uVar7] = puVar6[uVar2];
        puVar6[uVar2] = uVar8;
        uVar7 = uVar2;
      } while (3 < uVar5);
    }
    goto LAB_005561c7;
  }
  uVar8 = 0;
  while (createLiteralBindings::varNums._size != 0) {
    uVar5 = *createLiteralBindings::varNums._data;
    while (puVar6 = createLiteralBindings::varNums._data,
          uVar4 = createLiteralBindings::varNums._size - 1,
          createLiteralBindings::varNums._size = uVar4, uVar4 != 0) {
      uVar1 = *createLiteralBindings::varNums._data;
      *createLiteralBindings::varNums._data = createLiteralBindings::varNums._data[uVar4];
      puVar6[uVar4] = uVar1;
      Lib::BinaryHeap<unsigned_int,_Lib::Int>::bubbleDown(&createLiteralBindings::varNums,1);
      if ((createLiteralBindings::varNums._size == 0) ||
         (*createLiteralBindings::varNums._data != uVar5)) break;
    }
    bVar3 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
                      (&createLiteralBindings::variablePositions,uVar5,uVar8);
    if (bVar3) {
      puVar6 = *local_80;
      *local_80 = puVar6 + 1;
      *puVar6 = uVar5;
      uVar8 = uVar8 + 1;
    }
  }
  createLiteralBindings::varNums._size = 0;
  if (alts != (LiteralList *)0x0) {
    do {
      l2 = &alts->_head->super_Term;
      alts = alts->_tail;
      if (l2->_functor == 0) {
        bVar3 = MatchingUtils::haveVariantArgs(&baseLit->super_Term,l2);
        if (bVar3) {
          local_a0._arr = *altBindingData;
          local_a0._v2pos = &createLiteralBindings::variablePositions;
          MatchingUtils::matchArgs<Kernel::MLVariant_AUX::ArrayStoringBinder>
                    (&baseLit->super_Term,l2,&local_a0);
          **local_88 = *altBindingData;
          *local_88 = *local_88 + 1;
          *altBindingData = *altBindingData + uVar8;
          uVar5 = Clause::getLiteralPosition(local_90,(Literal *)l2);
          puVar6 = *altBindingData;
          *altBindingData = puVar6 + 1;
          *puVar6 = uVar5;
        }
        bVar3 = MatchingUtils::haveReversedVariantArgs(&baseLit->super_Term,l2);
        if (bVar3) {
          local_a0._arr = *altBindingData;
          local_a0._v2pos = &createLiteralBindings::variablePositions;
          MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
                    ((TermList)
                     (baseLit->super_Term)._args
                     [*(uint *)&(baseLit->super_Term).field_0xc & 0xfffffff]._content,
                     (TermList)l2->_args[(ulong)(*(uint *)&l2->field_0xc & 0xfffffff) - 1]._content,
                     &local_a0);
          MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
                    ((TermList)
                     (baseLit->super_Term)._args
                     [(ulong)(*(uint *)&(baseLit->super_Term).field_0xc & 0xfffffff) - 1]._content,
                     (TermList)l2->_args[*(uint *)&l2->field_0xc & 0xfffffff]._content,&local_a0);
          if (*(int *)&(baseLit->super_Term).field_0xc < 0) {
            MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
                      ((TermList)(baseLit->super_Term).field_9._sort._content,
                       (TermList)(l2->field_9)._sort._content,&local_a0);
          }
          **local_88 = *altBindingData;
          *local_88 = *local_88 + 1;
          *altBindingData = *altBindingData + uVar8;
          uVar5 = Clause::getLiteralPosition(local_90,(Literal *)l2);
          goto LAB_00556449;
        }
      }
      else {
        puVar6 = *altBindingData;
        if (uVar8 != 0) {
          local_a0._v2pos = &createLiteralBindings::variablePositions;
          local_a0._arr = puVar6;
          MatchingUtils::matchArgs<Kernel::MLVariant_AUX::ArrayStoringBinder>
                    (&baseLit->super_Term,l2,&local_a0);
          puVar6 = *altBindingData;
        }
        **local_88 = puVar6;
        *local_88 = *local_88 + 1;
        *altBindingData = *altBindingData + uVar8;
        uVar5 = Clause::getLiteralPosition(local_90,(Literal *)l2);
LAB_00556449:
        puVar6 = *altBindingData;
        *altBindingData = puVar6 + 1;
        *puVar6 = uVar5;
      }
    } while (alts != (List<Kernel::Literal_*> *)0x0);
  }
  local_78.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
       (_func_int **)&PTR__VariableIterator_00b3d820;
  if (local_78._stack._stack != (TermList **)0x0) {
    uVar7 = local_78._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *local_78._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78._stack._stack;
    }
    else if (uVar7 < 0x11) {
      *local_78._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_78._stack._stack;
    }
    else if (uVar7 < 0x19) {
      *local_78._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_78._stack._stack;
    }
    else if (uVar7 < 0x21) {
      *local_78._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_78._stack._stack;
    }
    else if (uVar7 < 0x31) {
      *local_78._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_78._stack._stack;
    }
    else if (uVar7 < 0x41) {
      *local_78._stack._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_78._stack._stack;
    }
    else {
      operator_delete(local_78._stack._stack,0x10);
    }
  }
  return true;
}

Assistant:

bool createLiteralBindings(Literal* baseLit, LiteralList* alts, Clause* instCl,
    unsigned*& boundVarData, unsigned**& altBindingPtrs, unsigned*& altBindingData)
{
  static UUMap variablePositions;
  static BinaryHeap<unsigned,Int> varNums;
  variablePositions.reset();
  varNums.reset();

  VariableIterator bvit(baseLit);
  while(bvit.hasNext()) {
    unsigned var=bvit.next().var();
    varNums.insert(var);
  }

  unsigned nextPos=0;
  while(!varNums.isEmpty()) {
    unsigned var=varNums.pop();
    while(!varNums.isEmpty() && varNums.top()==var) {
      varNums.pop();
    }
    if(variablePositions.insert(var,nextPos)) {
      *(boundVarData++)=var;
      nextPos++;
    }
  }
  unsigned numVars=nextPos;

  LiteralList::Iterator ait(alts);
  while(ait.hasNext()) {
    //handle multiple matches in equality!
    Literal* alit=ait.next();
    if(alit->isEquality()) {
      //we must try both possibilities
      if(MatchingUtils::haveVariantArgs(baseLit,alit)) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        MatchingUtils::matchArgs(baseLit,alit,binder);
        *altBindingPtrs=altBindingData;
        altBindingPtrs++;
        altBindingData+=numVars;

        //add pointer to the literal at
        //the end of the binding sequence
        *(altBindingData++)=instCl->getLiteralPosition(alit);
      }
      if(MatchingUtils::haveReversedVariantArgs(baseLit, alit)) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        MatchingUtils::matchTerms(*baseLit->nthArgument(0),*alit->nthArgument(1),binder);
        MatchingUtils::matchTerms(*baseLit->nthArgument(1),*alit->nthArgument(0),binder);
        if(baseLit->isTwoVarEquality()){
          ASS(alit->isTwoVarEquality());
          MatchingUtils::matchTerms(baseLit->twoVarEqSort(),alit->twoVarEqSort(),binder);
        } //matchArgs automatically matches the sorts of literals if one is a twoVarEq literal
          //This is the reason for the difference between the two cases.
        *altBindingPtrs=altBindingData;
        altBindingPtrs++;
        altBindingData+=numVars;

        //add pointer to the literal at
        //the end of the binding sequence
        *(altBindingData++)=instCl->getLiteralPosition(alit);
      }

    } else {
      if(numVars) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        ALWAYS(MatchingUtils::matchArgs(baseLit,alit,binder));
      }

      *altBindingPtrs=altBindingData;
      altBindingPtrs++;
      altBindingData+=numVars;

      //add index of the literal in instance clause at
      //the end of the binding sequence
      *(altBindingData++) = (size_t)instCl->getLiteralPosition(alit);
    }
  }
  return true;
}